

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAdapter.cpp
# Opt level: O3

MultipoleAtypeParameters * __thiscall
OpenMD::MultipoleAdapter::getMultipoleParam
          (MultipoleAtypeParameters *__return_storage_ptr__,MultipoleAdapter *this)

{
  undefined2 uVar1;
  bool bVar2;
  long lVar3;
  Mat3x3d *pMVar4;
  uint i;
  long lVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_50 [16];
  string local_40;
  
  bVar2 = AtomType::hasProperty(this->at_,(string *)MultipoleTypeID_abi_cxx11_);
  if (!bVar2) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "MultipoleAdapter::getMultipoleParam was passed an atomType (%s)\n\tthat does not appear to be a Multipole atom.\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_50,(string *)this->at_);
  if ((_func_int **)local_50._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "MultipoleAdapter::getMultipoleParam could not find Multipole\n\tparameters for atomType %s.\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((_func_int **)local_50._0_8_ != (_func_int **)0x0) goto LAB_0023109c;
  }
  else {
LAB_0023109c:
    lVar3 = __dynamic_cast(local_50._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::MultipoleAtypeParameters>::typeinfo,0);
    if (lVar3 != 0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
        }
      }
      goto LAB_0023113e;
    }
  }
  AtomType::getName_abi_cxx11_(&local_40,this->at_);
  snprintf(painCave.errMsg,2000,
           "MultipoleAdapter::getMultipoleParam could not convert\n\tGenericData to MultipoleAtypeData for atom type %s\n"
           ,local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar3 = 0;
LAB_0023113e:
  uVar1 = *(undefined2 *)(lVar3 + 0x28);
  __return_storage_ptr__->isDipole = (bool)(char)uVar1;
  __return_storage_ptr__->isQuadrupole = (bool)(char)((ushort)uVar1 >> 8);
  (__return_storage_ptr__->dipole).super_Vector<double,_3U>.data_[0] = 0.0;
  (__return_storage_ptr__->dipole).super_Vector<double,_3U>.data_[1] = 0.0;
  (__return_storage_ptr__->dipole).super_Vector<double,_3U>.data_[2] = 0.0;
  if ((MultipoleAtypeParameters *)(lVar3 + 0x28) != __return_storage_ptr__) {
    lVar5 = 0;
    do {
      (__return_storage_ptr__->dipole).super_Vector<double,_3U>.data_[lVar5] =
           *(double *)(lVar3 + 0x30 + lVar5 * 8);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    pMVar4 = &__return_storage_ptr__->quadrupole;
    lVar3 = lVar3 + 0x48;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        (pMVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar6] =
             *(double *)(lVar3 + lVar6 * 8);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar5 = lVar5 + 1;
      pMVar4 = (Mat3x3d *)
               ((pMVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
      lVar3 = lVar3 + 0x18;
    } while (lVar5 != 3);
  }
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

MultipoleAtypeParameters MultipoleAdapter::getMultipoleParam() {
    if (!isMultipole()) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "MultipoleAdapter::getMultipoleParam was passed an atomType (%s)\n"
          "\tthat does not appear to be a Multipole atom.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(MultipoleTypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAdapter::getMultipoleParam could not find Multipole\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<MultipoleAtypeData> multipoleData =
        std::dynamic_pointer_cast<MultipoleAtypeData>(data);
    if (multipoleData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAdapter::getMultipoleParam could not convert\n"
               "\tGenericData to MultipoleAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return multipoleData->getData();
  }